

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O2

REF_STATUS ref_validation_volume_status(REF_GRID ref_grid)

{
  REF_CELL ref_cell;
  REF_MPI ref_mpi;
  REF_STATUS RVar1;
  uint uVar2;
  undefined8 uVar3;
  int cell;
  char *pcVar4;
  REF_DBL max_volume;
  REF_DBL min_volume;
  double local_c8;
  REF_DBL local_c0;
  REF_DBL volume;
  REF_MPI local_b0;
  REF_INT nodes [27];
  
  local_b0 = ref_grid->mpi;
  ref_cell = ref_grid->cell[8];
  min_volume = 1e+200;
  max_volume = -1e+200;
  cell = 0;
  local_c0 = 1e+200;
  local_c8 = -1e+200;
  do {
    ref_mpi = local_b0;
    if (ref_cell->max <= cell) {
      volume = local_c0;
      uVar2 = ref_mpi_min(local_b0,&volume,&min_volume,3);
      if (uVar2 == 0) {
        uVar2 = ref_mpi_bcast(ref_mpi,&min_volume,1,3);
        if (uVar2 == 0) {
          volume = local_c8;
          uVar2 = ref_mpi_max(ref_mpi,&volume,&max_volume,3);
          if (uVar2 == 0) {
            uVar2 = ref_mpi_bcast(ref_mpi,&max_volume,1,3);
            if (uVar2 == 0) {
              if (ref_grid->mpi->id != 0) {
                return 0;
              }
              printf("volume %.5e %.5e\n",min_volume,max_volume);
              return 0;
            }
            pcVar4 = "min";
            uVar3 = 0x1eb;
          }
          else {
            pcVar4 = "mpi max";
            uVar3 = 0x1ea;
          }
        }
        else {
          pcVar4 = "min";
          uVar3 = 0x1e8;
        }
      }
      else {
        pcVar4 = "mpi min";
        uVar3 = 0x1e7;
      }
LAB_001e01f3:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
             uVar3,"ref_validation_volume_status",(ulong)uVar2,pcVar4);
      return uVar2;
    }
    RVar1 = ref_cell_nodes(ref_cell,cell,nodes);
    if (RVar1 == 0) {
      uVar2 = ref_node_tet_vol(ref_grid->node,nodes,&volume);
      if (uVar2 != 0) {
        pcVar4 = "vol";
        uVar3 = 0x1e2;
        goto LAB_001e01f3;
      }
      if (volume <= local_c0) {
        local_c0 = volume;
      }
      max_volume = local_c8;
      min_volume = local_c0;
      if (local_c8 <= volume) {
        max_volume = volume;
        local_c8 = volume;
      }
    }
    cell = cell + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_validation_volume_status(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL min_volume, max_volume;
  REF_DBL volume;

  min_volume = REF_DBL_MAX;
  max_volume = REF_DBL_MIN;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_node_tet_vol(ref_grid_node(ref_grid), nodes, &volume), "vol");
    min_volume = MIN(min_volume, volume);
    max_volume = MAX(max_volume, volume);
  }
  volume = min_volume;
  RSS(ref_mpi_min(ref_mpi, &volume, &min_volume, REF_DBL_TYPE), "mpi min");
  RSS(ref_mpi_bcast(ref_mpi, &min_volume, 1, REF_DBL_TYPE), "min");
  volume = max_volume;
  RSS(ref_mpi_max(ref_mpi, &volume, &max_volume, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &max_volume, 1, REF_DBL_TYPE), "min");

  if (ref_grid_once(ref_grid))
    printf("volume %.5e %.5e\n", min_volume, max_volume);

  return REF_SUCCESS;
}